

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
TargetPropertyEntryString::~TargetPropertyEntryString(TargetPropertyEntryString *this)

{
  TargetPropertyEntryString *this_local;
  
  ~TargetPropertyEntryString(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

TargetPropertyEntryString(BT<std::string> propertyValue,
                            cmLinkImplItem const& item = NoLinkImplItem)
    : cmGeneratorTarget::TargetPropertyEntry(item)
    , PropertyValue(std::move(propertyValue))
  {
  }